

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlParseElementStart(xmlParserCtxtPtr ctxt)

{
  uint uVar1;
  int local_74;
  xmlNodePtr pxStack_70;
  int nbNs;
  xmlNodePtr cur;
  undefined1 auStack_60 [4];
  int line;
  xmlParserNodeInfo node_info;
  xmlChar *URI;
  xmlChar *prefix;
  xmlChar *name;
  xmlParserCtxtPtr pxStack_18;
  int maxDepth;
  xmlParserCtxtPtr ctxt_local;
  
  name._4_4_ = 0x100;
  if ((ctxt->options & 0x80000U) != 0) {
    name._4_4_ = 0x800;
  }
  URI = (xmlChar *)0x0;
  node_info.end_line = 0;
  local_74 = 0;
  pxStack_18 = ctxt;
  if (name._4_4_ < ctxt->nameNr) {
    xmlFatalErrMsgInt(ctxt,XML_ERR_RESOURCE_LIMIT,
                      "Excessive depth in document: %d use XML_PARSE_HUGE option\n",ctxt->nameNr);
    xmlHaltParser(pxStack_18);
    ctxt_local._4_4_ = -1;
  }
  else {
    if (ctxt->record_info != 0) {
      node_info.node =
           (_xmlNode *)(ctxt->input->cur + (ctxt->input->consumed - (long)ctxt->input->base));
      node_info.begin_pos = (unsigned_long)ctxt->input->line;
    }
    if (ctxt->spaceNr == 0) {
      spacePush(ctxt,-1);
    }
    else if (*ctxt->space == -2) {
      spacePush(ctxt,-1);
    }
    else {
      spacePush(ctxt,*ctxt->space);
    }
    cur._4_4_ = pxStack_18->input->line;
    if (pxStack_18->sax2 == 0) {
      prefix = xmlParseStartTag(pxStack_18);
    }
    else {
      prefix = xmlParseStartTag2(pxStack_18,&URI,(xmlChar **)&node_info.end_line,&local_74);
    }
    if (prefix == (xmlChar *)0x0) {
      spacePop(pxStack_18);
      ctxt_local._4_4_ = -1;
    }
    else {
      nameNsPush(pxStack_18,prefix,URI,(xmlChar *)node_info.end_line,cur._4_4_,local_74);
      pxStack_70 = pxStack_18->node;
      if ((((pxStack_18->validate != 0) && (pxStack_18->wellFormed != 0)) &&
          (pxStack_18->myDoc != (xmlDocPtr)0x0)) &&
         ((pxStack_18->node != (xmlNodePtr)0x0 && (pxStack_18->node == pxStack_18->myDoc->children))
         )) {
        uVar1 = xmlValidateRoot(&pxStack_18->vctxt,pxStack_18->myDoc);
        pxStack_18->valid = uVar1 & pxStack_18->valid;
      }
      if ((*pxStack_18->input->cur == '/') && (pxStack_18->input->cur[1] == '>')) {
        pxStack_18->input->cur = pxStack_18->input->cur + 2;
        pxStack_18->input->col = pxStack_18->input->col + 2;
        if (*pxStack_18->input->cur == '\0') {
          xmlParserGrow(pxStack_18);
        }
        if (pxStack_18->sax2 == 0) {
          if (((pxStack_18->sax != (_xmlSAXHandler *)0x0) &&
              (pxStack_18->sax->endElement != (endElementSAXFunc)0x0)) &&
             (pxStack_18->disableSAX == 0)) {
            (*pxStack_18->sax->endElement)(pxStack_18->userData,prefix);
          }
        }
        else if (((pxStack_18->sax != (_xmlSAXHandler *)0x0) &&
                 (pxStack_18->sax->endElementNs != (endElementNsSAX2Func)0x0)) &&
                (pxStack_18->disableSAX == 0)) {
          (*pxStack_18->sax->endElementNs)
                    (pxStack_18->userData,prefix,URI,(xmlChar *)node_info.end_line);
        }
        namePop(pxStack_18);
        spacePop(pxStack_18);
        if (0 < local_74) {
          xmlParserNsPop(pxStack_18,local_74);
        }
        if ((pxStack_70 != (xmlNodePtr)0x0) && (pxStack_18->record_info != 0)) {
          _auStack_60 = pxStack_70;
          node_info.begin_line =
               (unsigned_long)
               (pxStack_18->input->cur +
               (pxStack_18->input->consumed - (long)pxStack_18->input->base));
          node_info.end_pos = (unsigned_long)pxStack_18->input->line;
          xmlParserAddNodeInfo(pxStack_18,(xmlParserNodeInfoPtr)auStack_60);
        }
        ctxt_local._4_4_ = 1;
      }
      else if (*pxStack_18->input->cur == '>') {
        pxStack_18->input->col = pxStack_18->input->col + 1;
        pxStack_18->input->cur = pxStack_18->input->cur + 1;
        if (*pxStack_18->input->cur == '\0') {
          xmlParserGrow(pxStack_18);
        }
        if ((pxStack_70 != (xmlNodePtr)0x0) && (pxStack_18->record_info != 0)) {
          _auStack_60 = pxStack_70;
          node_info.begin_line = 0;
          node_info.end_pos = 0;
          xmlParserAddNodeInfo(pxStack_18,(xmlParserNodeInfoPtr)auStack_60);
        }
        ctxt_local._4_4_ = 0;
      }
      else {
        xmlFatalErrMsgStrIntStr
                  (pxStack_18,XML_ERR_GT_REQUIRED,"Couldn\'t find end of Start Tag %s line %d\n",
                   prefix,cur._4_4_,(xmlChar *)0x0);
        nodePop(pxStack_18);
        namePop(pxStack_18);
        spacePop(pxStack_18);
        if (0 < local_74) {
          xmlParserNsPop(pxStack_18,local_74);
        }
        ctxt_local._4_4_ = -1;
      }
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlParseElementStart(xmlParserCtxtPtr ctxt) {
    int maxDepth = (ctxt->options & XML_PARSE_HUGE) ? 2048 : 256;
    const xmlChar *name;
    const xmlChar *prefix = NULL;
    const xmlChar *URI = NULL;
    xmlParserNodeInfo node_info;
    int line;
    xmlNodePtr cur;
    int nbNs = 0;

    if (ctxt->nameNr > maxDepth) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_RESOURCE_LIMIT,
                "Excessive depth in document: %d use XML_PARSE_HUGE option\n",
                ctxt->nameNr);
	xmlHaltParser(ctxt);
	return(-1);
    }

    /* Capture start position */
    if (ctxt->record_info) {
        node_info.begin_pos = ctxt->input->consumed +
                          (CUR_PTR - ctxt->input->base);
	node_info.begin_line = ctxt->input->line;
    }

    if (ctxt->spaceNr == 0)
	spacePush(ctxt, -1);
    else if (*ctxt->space == -2)
	spacePush(ctxt, -1);
    else
	spacePush(ctxt, *ctxt->space);

    line = ctxt->input->line;
#ifdef LIBXML_SAX1_ENABLED
    if (ctxt->sax2)
#endif /* LIBXML_SAX1_ENABLED */
        name = xmlParseStartTag2(ctxt, &prefix, &URI, &nbNs);
#ifdef LIBXML_SAX1_ENABLED
    else
	name = xmlParseStartTag(ctxt);
#endif /* LIBXML_SAX1_ENABLED */
    if (name == NULL) {
	spacePop(ctxt);
        return(-1);
    }
    nameNsPush(ctxt, name, prefix, URI, line, nbNs);
    cur = ctxt->node;

#ifdef LIBXML_VALID_ENABLED
    /*
     * [ VC: Root Element Type ]
     * The Name in the document type declaration must match the element
     * type of the root element.
     */
    if (ctxt->validate && ctxt->wellFormed && ctxt->myDoc &&
        ctxt->node && (ctxt->node == ctxt->myDoc->children))
        ctxt->valid &= xmlValidateRoot(&ctxt->vctxt, ctxt->myDoc);
#endif /* LIBXML_VALID_ENABLED */

    /*
     * Check for an Empty Element.
     */
    if ((RAW == '/') && (NXT(1) == '>')) {
        SKIP(2);
	if (ctxt->sax2) {
	    if ((ctxt->sax != NULL) && (ctxt->sax->endElementNs != NULL) &&
		(!ctxt->disableSAX))
		ctxt->sax->endElementNs(ctxt->userData, name, prefix, URI);
#ifdef LIBXML_SAX1_ENABLED
	} else {
	    if ((ctxt->sax != NULL) && (ctxt->sax->endElement != NULL) &&
		(!ctxt->disableSAX))
		ctxt->sax->endElement(ctxt->userData, name);
#endif /* LIBXML_SAX1_ENABLED */
	}
	namePop(ctxt);
	spacePop(ctxt);
	if (nbNs > 0)
	    xmlParserNsPop(ctxt, nbNs);
	if (cur != NULL && ctxt->record_info) {
            node_info.node = cur;
            node_info.end_pos = ctxt->input->consumed +
                                (CUR_PTR - ctxt->input->base);
            node_info.end_line = ctxt->input->line;
            xmlParserAddNodeInfo(ctxt, &node_info);
	}
	return(1);
    }
    if (RAW == '>') {
        NEXT1;
        if (cur != NULL && ctxt->record_info) {
            node_info.node = cur;
            node_info.end_pos = 0;
            node_info.end_line = 0;
            xmlParserAddNodeInfo(ctxt, &node_info);
        }
    } else {
        xmlFatalErrMsgStrIntStr(ctxt, XML_ERR_GT_REQUIRED,
		     "Couldn't find end of Start Tag %s line %d\n",
		                name, line, NULL);

	/*
	 * end of parsing of this node.
	 */
	nodePop(ctxt);
	namePop(ctxt);
	spacePop(ctxt);
	if (nbNs > 0)
	    xmlParserNsPop(ctxt, nbNs);
	return(-1);
    }

    return(0);
}